

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O3

void __thiscall absl::lts_20250127::Cord::SetCrcCordState(Cord *this,CrcCordState *state)

{
  char cVar1;
  undefined8 uVar2;
  CordzUpdateScope CVar3;
  CordRep *pCVar4;
  CordRepCrc *pCVar5;
  CordzInfo *this_00;
  long lVar6;
  ulong len;
  long in_FS_OFFSET;
  CordzUpdateScope scope;
  CrcCordState local_40;
  CordzUpdateScope local_38;
  CrcCordState local_30;
  CrcCordState local_28;
  
  cVar1 = (this->contents_).data_.rep_.field_0.data[0];
  if (((long)cVar1 & 1U) == 0) {
    if (cVar1 != '\0') {
      len = (ulong)(long)cVar1 >> 1;
      pCVar4 = &cord_internal::CordRepFlat::NewImpl<4096ul>(len)->super_CordRep;
      pCVar4->length = len;
      if (((this->contents_).data_.rep_.field_0.data[0] & 1U) != 0) {
        __assert_fail("!is_tree()",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                      ,0x28e,
                      "void absl::cord_internal::InlineData::copy_max_inline_to(char *) const");
      }
      uVar2 = *(undefined8 *)((long)&(this->contents_).data_.rep_.field_0.as_tree.cordz_info + 1);
      *(CordRep **)((long)&pCVar4[1].length + 4) = (this->contents_).data_.rep_.field_0.as_tree.rep;
      *(undefined8 *)pCVar4->storage = uVar2;
      crc_internal::CrcCordState::CrcCordState(&local_30,state);
      pCVar5 = cord_internal::CordRepCrc::New(pCVar4,&local_30);
      crc_internal::CrcCordState::~CrcCordState(&local_30);
      if (pCVar5 == (CordRepCrc *)0x0) goto LAB_002941dc;
      (this->contents_).data_.rep_.field_0.as_tree.rep = &pCVar5->super_CordRep;
      (this->contents_).data_.rep_.field_0.as_tree.cordz_info = 1;
      lVar6 = *(long *)(in_FS_OFFSET + -0x58);
      if (lVar6 < 2) {
        SetCrcCordState();
        return;
      }
      goto LAB_00294185;
    }
  }
  else {
    pCVar4 = (this->contents_).data_.rep_.field_0.as_tree.rep;
    if (pCVar4->length != 0) {
      local_38.info_ = cord_internal::InlineData::cordz_info((InlineData *)this);
      if (local_38.info_ != (CordzInfo *)0x0) {
        cord_internal::CordzInfo::Lock(local_38.info_,kSetExpectedChecksum);
      }
      if (((this->contents_).data_.rep_.field_0.data[0] & 1U) == 0) {
        __assert_fail("is_tree()",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                      ,0x274,"CordRep *absl::cord_internal::InlineData::as_tree() const");
      }
      pCVar4 = (this->contents_).data_.rep_.field_0.as_tree.rep;
      crc_internal::CrcCordState::CrcCordState(&local_40,state);
      pCVar5 = cord_internal::CordRepCrc::New(pCVar4,&local_40);
      crc_internal::CrcCordState::~CrcCordState(&local_40);
      CVar3.info_ = local_38.info_;
      if (pCVar5 == (CordRepCrc *)0x0) {
        __assert_fail("rep",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord.h"
                      ,0x4f6,
                      "void absl::Cord::InlineRep::SetTree(absl::Nonnull<CordRep *>, const CordzUpdateScope &)"
                     );
      }
      if (((this->contents_).data_.rep_.field_0.data[0] & 1U) != 0) {
        (this->contents_).data_.rep_.field_0.as_tree.rep = &pCVar5->super_CordRep;
        if (local_38.info_ != (CordzInfo *)0x0) {
          Mutex::AssertHeld(&(local_38.info_)->mutex_);
          (CVar3.info_)->rep_ = &pCVar5->super_CordRep;
        }
        cord_internal::CordzUpdateScope::~CordzUpdateScope(&local_38);
        return;
      }
      __assert_fail("data_.is_tree()",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord.h"
                    ,0x4f7,
                    "void absl::Cord::InlineRep::SetTree(absl::Nonnull<CordRep *>, const CordzUpdateScope &)"
                   );
    }
    if (pCVar4->tag != '\x02') {
      __assert_fail("rep->IsCrc()",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord.h"
                    ,0x527,"void absl::Cord::InlineRep::MaybeRemoveEmptyCrcNode()");
    }
    if (pCVar4[1].length != 0) {
      __assert_fail("rep->crc()->child == nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord.h"
                    ,0x528,"void absl::Cord::InlineRep::MaybeRemoveEmptyCrcNode()");
    }
    this_00 = cord_internal::InlineData::cordz_info((InlineData *)this);
    if (this_00 != (CordzInfo *)0x0) {
      cord_internal::CordzInfo::Untrack(this_00);
    }
    cord_internal::CordRep::Unref(pCVar4);
    (this->contents_).data_.rep_.field_0.as_tree.cordz_info = 0;
    (this->contents_).data_.rep_.field_0.as_tree.rep = (CordRep *)0x0;
  }
  crc_internal::CrcCordState::CrcCordState(&local_28,state);
  pCVar5 = cord_internal::CordRepCrc::New((CordRep *)0x0,&local_28);
  crc_internal::CrcCordState::~CrcCordState(&local_28);
  if (pCVar5 == (CordRepCrc *)0x0) {
LAB_002941dc:
    __assert_fail("rep",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord.h"
                  ,0x4e8,
                  "void absl::Cord::InlineRep::EmplaceTree(absl::Nonnull<CordRep *>, MethodIdentifier)"
                 );
  }
  (this->contents_).data_.rep_.field_0.as_tree.rep = &pCVar5->super_CordRep;
  (this->contents_).data_.rep_.field_0.as_tree.cordz_info = 1;
  lVar6 = *(long *)(in_FS_OFFSET + -0x58);
  if (lVar6 < 2) {
    SetCrcCordState();
    return;
  }
LAB_00294185:
  *(long *)(in_FS_OFFSET + -0x58) = lVar6 + -1;
  return;
}

Assistant:

void Cord::SetCrcCordState(crc_internal::CrcCordState state) {
  auto constexpr method = CordzUpdateTracker::kSetExpectedChecksum;
  if (empty()) {
    contents_.MaybeRemoveEmptyCrcNode();
    CordRep* rep = CordRepCrc::New(nullptr, std::move(state));
    contents_.EmplaceTree(rep, method);
  } else if (!contents_.is_tree()) {
    CordRep* rep = contents_.MakeFlatWithExtraCapacity(0);
    rep = CordRepCrc::New(rep, std::move(state));
    contents_.EmplaceTree(rep, method);
  } else {
    const CordzUpdateScope scope(contents_.data_.cordz_info(), method);
    CordRep* rep = CordRepCrc::New(contents_.data_.as_tree(), std::move(state));
    contents_.SetTree(rep, scope);
  }
}